

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O1

int AF_AActor_A_SetTics(VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,
                       VMReturn *ret,int numret)

{
  int iVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  void *pvVar4;
  PClass *pPVar5;
  undefined8 uVar6;
  PClass *pPVar7;
  DPSprite *pDVar8;
  undefined4 in_register_00000014;
  char *pcVar9;
  bool bVar10;
  undefined1 auVar11 [16];
  
  pPVar5 = AActor::RegistrationInfo.MyClass;
  uVar6 = CONCAT44(in_register_00000014,numparam);
  if (0 < numparam) {
    if (((param->field_0).field_3.Type != '\x03') ||
       (((param->field_0).field_1.atag != 1 && ((param->field_0).field_1.a != (void *)0x0)))) {
LAB_003dcd0c:
      pcVar9 = 
      "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
      ;
      goto LAB_003dcd5f;
    }
    puVar2 = (undefined8 *)(param->field_0).field_1.a;
    if (puVar2 != (undefined8 *)0x0) {
      if (puVar2[1] == 0) {
        auVar11 = (**(code **)*puVar2)(puVar2);
        uVar6 = auVar11._8_8_;
        puVar2[1] = auVar11._0_8_;
      }
      pPVar7 = (PClass *)puVar2[1];
      bVar10 = pPVar7 == (PClass *)0x0;
      ret = (VMReturn *)(ulong)!bVar10;
      uVar6 = CONCAT71((int7)((ulong)uVar6 >> 8),bVar10);
      defaultparam = (TArray<VMValue,_VMValue> *)(ulong)(pPVar7 == pPVar5 || bVar10);
      if (pPVar7 != pPVar5 && !bVar10) {
        do {
          pPVar7 = pPVar7->ParentClass;
          ret = (VMReturn *)(ulong)(pPVar7 != (PClass *)0x0);
          if (pPVar7 == pPVar5) break;
        } while (pPVar7 != (PClass *)0x0);
      }
      if ((char)ret == '\0') {
        pcVar9 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
        goto LAB_003dcd5f;
      }
    }
    pPVar5 = AActor::RegistrationInfo.MyClass;
    if (numparam != 1) {
      if ((param[1].field_0.field_3.Type != '\x03') ||
         ((param[1].field_0.field_1.atag != 1 && (param[1].field_0.field_1.a != (void *)0x0))))
      goto LAB_003dcd0c;
      puVar3 = (undefined8 *)param[1].field_0.field_1.a;
      if (puVar3 != (undefined8 *)0x0) {
        if (puVar3[1] == 0) {
          uVar6 = (**(code **)*puVar3)(puVar3,defaultparam,uVar6,ret);
          puVar3[1] = uVar6;
        }
        pPVar7 = (PClass *)puVar3[1];
        bVar10 = pPVar7 != (PClass *)0x0;
        if (pPVar7 != pPVar5 && bVar10) {
          do {
            pPVar7 = pPVar7->ParentClass;
            bVar10 = pPVar7 != (PClass *)0x0;
            if (pPVar7 == pPVar5) break;
          } while (pPVar7 != (PClass *)0x0);
        }
        if (!bVar10) {
          pcVar9 = "stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_003dcd5f;
        }
      }
      if (2 < numparam) {
        if (param[2].field_0.field_3.Type == '\x03') {
          if (numparam == 3) {
            pcVar9 = "(paramnum) < numparam";
          }
          else {
            if (param[3].field_0.field_3.Type == '\0') {
              pvVar4 = param[2].field_0.field_1.a;
              iVar1 = param[3].field_0.i;
              if ((pvVar4 == (void *)0x0 || (player_t *)puVar2[0x46] == (player_t *)0x0) ||
                 (*(int *)((long)pvVar4 + 8) != 1)) {
                if ((pvVar4 == (void *)0x0) || (*(int *)((long)pvVar4 + 8) == 0)) {
                  *(int *)(puVar2 + 0x33) = iVar1;
                }
              }
              else {
                pDVar8 = player_t::FindPSprite
                                   ((player_t *)puVar2[0x46],*(int *)((long)pvVar4 + 0xc));
                if (pDVar8 != (DPSprite *)0x0) {
                  pDVar8->Tics = iVar1;
                }
              }
              return 0;
            }
            pcVar9 = "param[paramnum].Type == REGT_INT";
          }
          __assert_fail(pcVar9,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                        ,0x1659,
                        "int AF_AActor_A_SetTics(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
        pcVar9 = "param[paramnum].Type == REGT_POINTER";
        goto LAB_003dcd5f;
      }
    }
  }
  pcVar9 = "(paramnum) < numparam";
LAB_003dcd5f:
  __assert_fail(pcVar9,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                ,0x1658,
                "int AF_AActor_A_SetTics(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_SetTics)
{
	PARAM_ACTION_PROLOGUE(AActor);
	PARAM_INT(tics_to_set);

	if (ACTION_CALL_FROM_PSPRITE())
	{
		DPSprite *pspr = self->player->FindPSprite(stateinfo->mPSPIndex);
		if (pspr != nullptr)
		{
			pspr->Tics = tics_to_set;
			return 0;
		}
	}
	else if (ACTION_CALL_FROM_ACTOR())
	{
		// Just set tics for self.
		self->tics = tics_to_set;
	}
	// for inventory state chains this needs to be ignored.
	return 0;
}